

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_rescale(secp256k1_gej *r,secp256k1_fe *s)

{
  secp256k1_fe *r_00;
  long lVar1;
  byte bVar2;
  secp256k1_scalar sVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  sbyte sVar8;
  ulong uVar9;
  secp256k1_scalar *b;
  secp256k1_gej *r_01;
  ulong uVar10;
  secp256k1_ge *r_02;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  uint uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  secp256k1_fe zz;
  int iStack_1c8;
  undefined1 auStack_180 [16];
  undefined1 auStack_170 [16];
  undefined1 auStack_160 [16];
  undefined1 auStack_150 [16];
  secp256k1_fe *psStack_138;
  ulong uStack_130;
  secp256k1_scalar sStack_124;
  secp256k1_fe sStack_120;
  undefined1 auStack_f0 [32];
  undefined1 auStack_d0 [16];
  secp256k1_fe sStack_c0;
  secp256k1_gej *psStack_88;
  undefined8 uStack_80;
  secp256k1_fe local_50;
  
  secp256k1_gej_verify(r);
  secp256k1_fe_verify(s);
  secp256k1_fe_verify(s);
  uVar6 = (s->n[4] >> 0x30) * 0x1000003d1 + s->n[0];
  if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
    uVar9 = (uVar6 >> 0x34) + s->n[1];
    r_01 = (secp256k1_gej *)((uVar9 >> 0x34) + s->n[2]);
    uVar10 = ((ulong)r_01 >> 0x34) + s->n[3];
    uVar12 = (uVar10 >> 0x34) + (s->n[4] & 0xffffffffffff);
    if ((((uVar9 | uVar6 | (ulong)r_01 | uVar10) & 0xfffffffffffff) == 0 && uVar12 == 0) ||
       (((uVar6 | 0x1000003d0) & uVar9 & (ulong)r_01 & uVar10 & (uVar12 ^ 0xf000000000000)) ==
        0xfffffffffffff)) {
      secp256k1_gej_rescale_cold_1();
      uStack_80 = 0x1000003d0;
      auStack_180 = (undefined1  [16])0x0;
      auStack_170 = (undefined1  [16])0x0;
      auStack_160 = (undefined1  [16])0x0;
      auStack_150 = (undefined1  [16])0x0;
      psStack_88 = r;
      secp256k1_scalar_add(&sStack_124,(secp256k1_scalar *)(uVar10 + 4),b);
      sVar3 = sStack_124;
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)sStack_124);
      sStack_124 = 0;
      auStack_f0._8_8_ = &sStack_124;
      auStack_f0._0_8_ = 0x4d430001;
      auStack_f0._16_16_ = ZEXT816(4);
      bVar15 = false;
      auStack_d0 = ZEXT816(0);
      uVar6 = (long)auStack_f0 * 8;
      uVar9 = uVar6 >> 0x33;
      uVar6 = ((uVar6 | (ulong)auStack_f0 >> 0x3d) << 0xd | uVar9) >> 3;
      r_02 = (secp256k1_ge *)(uVar6 << 0x33 | (uVar9 << 0x3d | uVar6) >> 0xd);
      psStack_138 = (secp256k1_fe *)(uVar10 + 0x70);
      iStack_1c8 = 1;
      uStack_130 = uVar10;
      while( true ) {
        sVar8 = 0;
        uVar14 = 0;
        iVar5 = iStack_1c8;
        bVar4 = true;
        do {
          bVar13 = bVar4;
          bVar2 = (byte)iVar5 & 0x1f;
          uVar14 = (sVar3 >> bVar2 | sVar3 << 0x20 - bVar2) << sVar8 ^
                   uVar14 & (-2 << sVar8 | 0xfffffffeU >> 0x20 - sVar8);
          iVar5 = iVar5 + 2;
          sVar8 = 1;
          bVar4 = false;
        } while (bVar13);
        uVar6 = 0;
        bVar4 = true;
        do {
          bVar13 = bVar4;
          uVar11 = (uint)(uVar6 == ((uVar14 ^ uVar14 >> 1) & 1));
          uVar10 = (ulong)((long)r_02 << 3) >> 0x33;
          uVar12 = (((long)r_02 << 3 | (ulong)r_02 >> 0x3d) << 0xd | uVar10) >> 3;
          uVar9 = uVar12 << 0x33;
          lVar1 = (long)(int)uVar11 + -1;
          lVar7 = -(long)(int)uVar11;
          auVar16._8_4_ = (int)lVar1;
          auVar16._0_8_ = lVar1;
          auVar16._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar18._8_4_ = (int)lVar7;
          auVar18._0_8_ = lVar7;
          auVar18._12_4_ = (int)((ulong)lVar7 >> 0x20);
          auStack_180 = *(undefined1 (*) [16])secp256k1_ecmult_gen_prec_table[0][uVar6].x.n &
                        auVar18 | auStack_180 & auVar16;
          auStack_170 = auVar18 & *(undefined1 (*) [16])
                                   (secp256k1_ecmult_gen_prec_table[0][uVar6].x.n + 2) |
                        auVar16 & auStack_170;
          uVar10 = (uVar9 | (uVar10 << 0x3d | uVar12) >> 0xd) << 3;
          uVar12 = uVar10 >> 0x33;
          uVar9 = ((uVar10 | uVar9 >> 0x3d) << 0xd | uVar12) >> 3;
          r_02 = (secp256k1_ge *)(uVar9 << 0x33 | (uVar12 << 0x3d | uVar9) >> 0xd);
          lVar1 = (long)(int)uVar11 + -1;
          lVar7 = -(long)(int)uVar11;
          auVar17._8_4_ = (int)lVar1;
          auVar17._0_8_ = lVar1;
          auVar17._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar19._8_4_ = (int)lVar7;
          auVar19._0_8_ = lVar7;
          auVar19._12_4_ = (int)((ulong)lVar7 >> 0x20);
          auStack_160 = *(undefined1 (*) [16])secp256k1_ecmult_gen_prec_table[0][uVar6].y.n &
                        auVar19 | auStack_160 & auVar17;
          auStack_150 = auVar19 & *(undefined1 (*) [16])
                                   (secp256k1_ecmult_gen_prec_table[0][uVar6].y.n + 2) |
                        auVar17 & auStack_150;
          uVar6 = 1;
          bVar4 = false;
        } while (bVar13);
        secp256k1_ge_from_storage(r_02,(secp256k1_ge_storage *)auStack_180);
        secp256k1_fe_verify(&sStack_c0);
        secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)sStack_c0.magnitude,1);
        sStack_120.n[1] = 0x3ffffffffffffc - sStack_c0.n[1];
        sStack_120.n[0] = 0x3ffffbfffff0bc - sStack_c0.n[0];
        sStack_120.n[3] = 0x3ffffffffffffc - sStack_c0.n[3];
        sStack_120.n[2] = 0x3ffffffffffffc - sStack_c0.n[2];
        sStack_120._40_8_ = 2;
        sStack_120.n[4] = 0x3fffffffffffc - sStack_c0.n[4];
        secp256k1_fe_verify(&sStack_120);
        secp256k1_fe_cmov(&sStack_c0,&sStack_120,uVar14 >> 1 & 1);
        if (bVar15) {
          secp256k1_gej_add_ge(r_01,r_01,(secp256k1_ge *)auStack_f0);
        }
        else {
          secp256k1_gej_set_ge(r_01,(secp256k1_ge *)auStack_f0);
          secp256k1_gej_rescale(r_01,psStack_138);
        }
        bVar15 = iStack_1c8 == 0;
        iStack_1c8 = iStack_1c8 + -1;
        if (bVar15) break;
        secp256k1_gej_double(r_01,r_01);
        bVar15 = true;
        r_02 = (secp256k1_ge *)auStack_f0;
      }
      secp256k1_gej_add_ge(r_01,r_01,(secp256k1_ge *)(uStack_130 + 8));
      return;
    }
  }
  secp256k1_fe_sqr(&local_50,s);
  secp256k1_fe_mul(&r->x,&r->x,&local_50);
  r_00 = &r->y;
  secp256k1_fe_mul(r_00,r_00,&local_50);
  secp256k1_fe_mul(r_00,r_00,s);
  secp256k1_fe_mul(&r->z,&r->z,s);
  secp256k1_gej_verify(r);
  return;
}

Assistant:

static void secp256k1_gej_rescale(secp256k1_gej *r, const secp256k1_fe *s) {
    /* Operations: 4 mul, 1 sqr */
    secp256k1_fe zz;
    SECP256K1_GEJ_VERIFY(r);
    SECP256K1_FE_VERIFY(s);
    VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(s));

    secp256k1_fe_sqr(&zz, s);
    secp256k1_fe_mul(&r->x, &r->x, &zz);                /* r->x *= s^2 */
    secp256k1_fe_mul(&r->y, &r->y, &zz);
    secp256k1_fe_mul(&r->y, &r->y, s);                  /* r->y *= s^3 */
    secp256k1_fe_mul(&r->z, &r->z, s);                  /* r->z *= s   */

    SECP256K1_GEJ_VERIFY(r);
}